

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O3

psa_status_t psa_its_read_file(psa_storage_uid_t uid,psa_storage_info_t *p_info,FILE **p_stream)

{
  psa_status_t pVar1;
  FILE *__stream;
  size_t sVar2;
  psa_its_file_header_t header;
  char filename [25];
  long local_48;
  psa_storage_info_t local_40;
  char local_38 [32];
  
  *p_stream = (FILE *)0x0;
  snprintf(local_38,0x19,"%s%08lx%08lx%s","",uid >> 0x20,uid & 0xffffffff,".psa_its");
  __stream = fopen(local_38,"rb");
  *p_stream = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    pVar1 = -0x8c;
  }
  else {
    sVar2 = fread(&local_48,1,0x10,__stream);
    pVar1 = -0x98;
    if ((sVar2 == 0x10) && (local_48 == 0x53544900415350)) {
      *p_info = local_40;
      pVar1 = 0;
    }
  }
  return pVar1;
}

Assistant:

static psa_status_t psa_its_read_file( psa_storage_uid_t uid,
                                       struct psa_storage_info_t *p_info,
                                       FILE **p_stream )
{
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    psa_its_file_header_t header;
    size_t n;

    *p_stream = NULL;
    psa_its_fill_filename( uid, filename );
    *p_stream = fopen( filename, "rb" );
    if( *p_stream == NULL )
        return( PSA_ERROR_DOES_NOT_EXIST );

    n = fread( &header, 1, sizeof( header ), *p_stream );
    if( n != sizeof( header ) )
        return( PSA_ERROR_DATA_CORRUPT );
    if( memcmp( header.magic, PSA_ITS_MAGIC_STRING,
                PSA_ITS_MAGIC_LENGTH ) != 0 )
        return( PSA_ERROR_DATA_CORRUPT );

    p_info->size = ( header.size[0] |
                     header.size[1] << 8 |
                     header.size[2] << 16 |
                     header.size[3] << 24 );
    p_info->flags = ( header.flags[0] |
                      header.flags[1] << 8 |
                      header.flags[2] << 16 |
                      header.flags[3] << 24 );
    return( PSA_SUCCESS );
}